

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O3

NaReal __thiscall NaNNUnit::DerivActFunc(NaNNUnit *this,uint iLayer,NaReal z)

{
  double extraout_XMM0_Qa;
  
  if (((this->descr).nHidLayers == iLayer) && ((this->descr).eLastActFunc == afkLinear)) {
    return 1.0;
  }
  (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0x10])();
  return (1.0 - extraout_XMM0_Qa * extraout_XMM0_Qa) * 0.5;
}

Assistant:

NaReal
NaNNUnit::DerivActFunc (unsigned iLayer, NaReal z)
{
    NaReal  f;
    if(OutputLayer() == iLayer && descr.eLastActFunc == afkLinear){
        // Linear transfer derivation
        f = 1.;
    }
    else /* sigmoid */{
        f = ActFunc(iLayer, z);
        f = 0.5 * (1. - f * f);
    }
    return f;
}